

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_holder<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>::
cni_holder(cni_holder<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
           *this,_func_void_any_ptr_any_ptr **func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_0023c1d0;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (_func_void_any_ptr_any_ptr *)0x0;
  local_28._8_8_ = 0;
  if (*func != (_func_void_any_ptr_any_ptr *)0x0) {
    pcStack_10 = std::
                 _Function_handler<void_(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)*func;
  }
  std::function<void_(cs_impl::any_&,_cs_impl::any_&)>::function
            (&(this->mCni).mFunc,(function<void_(cs_impl::any_&,_cs_impl::any_&)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}